

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O2

bool __thiscall
srell::regex_internal::re_compiler<char,_srell::u8regex_traits<char>_>::register_if_negatedcharclass
          (re_compiler<char,_srell::u8regex_traits<char>_> *this,state_type *atom)

{
  uint uVar1;
  undefined1 auStack_38 [8];
  range_pairs ranges;
  
  if ((atom->type == st_character_class) && (((atom->field_5).is_not & 1U) != 0)) {
    auStack_38 = (undefined1  [8])0x0;
    ranges.rparray_.buffer_ = (pointer)0x0;
    ranges.rparray_.size_ = 0;
    add_predefclass_to_charclass(this,(range_pairs *)auStack_38,atom);
    uVar1 = re_character_class::register_newclass
                      (&(this->super_re_object_core<char,_srell::u8regex_traits<char>_>).
                        character_class,(range_pairs *)auStack_38);
    (atom->field_0).number = uVar1;
    (atom->field_5).is_not = false;
    free((void *)auStack_38);
  }
  return true;
}

Assistant:

bool register_if_negatedcharclass(state_type &atom)
	{
		if (atom.is_negcharclass())
		{
			range_pairs ranges;

			add_predefclass_to_charclass(ranges, atom);
			atom.number = this->character_class.register_newclass(ranges);
			atom.is_not = false;
		}
		return true;
	}